

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O0

bool Js::JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
               (PropertyOperationFlags flags,ScriptContext *scriptContext,PCWSTR varName)

{
  bool bVar1;
  ThreadContext *this;
  int32 hCode;
  bool bVar2;
  bool isNonConfigThrow;
  PCWSTR varName_local;
  ScriptContext *scriptContext_local;
  PropertyOperationFlags flags_local;
  
  bVar2 = (flags & PropertyOperation_ThrowOnDeleteIfNotConfig) ==
          PropertyOperation_ThrowOnDeleteIfNotConfig;
  if ((bVar2) || ((flags & PropertyOperation_StrictMode) != PropertyOperation_None)) {
    this = ScriptContext::GetThreadContext(scriptContext);
    bVar1 = ThreadContext::RecordImplicitException(this);
    if (bVar1) {
      hCode = -0x7ff5ec4f;
      if (bVar2) {
        hCode = -0x7ff5e9de;
      }
      ThrowTypeError(scriptContext,hCode,varName);
    }
    scriptContext_local._7_1_ = true;
  }
  else {
    scriptContext_local._7_1_ = false;
  }
  return scriptContext_local._7_1_;
}

Assistant:

bool JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(PropertyOperationFlags flags, ScriptContext* scriptContext, PCWSTR varName)
    {
        bool isNonConfigThrow = (flags & PropertyOperation_ThrowOnDeleteIfNotConfig) == PropertyOperation_ThrowOnDeleteIfNotConfig;

        if (isNonConfigThrow || flags & PropertyOperation_StrictMode)
        {
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, isNonConfigThrow ? JSERR_CantDeleteNonConfigProp : JSERR_CantDeleteExpr, varName);
            }
            return true;
        }
        return false;
    }